

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv2dTest.c
# Opt level: O0

void main(void)

{
  int iVar1;
  long N2_00;
  long N1;
  void *__ptr;
  long unaff_RBP;
  double dVar2;
  float *unaff_retaddr;
  long in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  uint __seed;
  int rannum;
  uint randseed;
  FILE *fdataout;
  long M2;
  long M;
  long TheErr;
  long i2;
  long i1;
  float *b;
  float *a;
  long dataSize2;
  long dataSize;
  long kernSize2;
  long kernSize;
  long N2;
  long N;
  
  N2 = 0x100;
  kernSize = 0x40;
  kernSize2 = 0x35;
  dataSize = 0x1d;
  dataSize2 = 0xcc;
  a = (float *)0x24;
  __seed = 0x309;
  N = unaff_RBP;
  printf(" %zu  Byte Floats \n",4);
  printf(" randseed = %10u\n",(ulong)__seed);
  srand(__seed);
  dVar2 = log((double)N2);
  N2_00 = lround(dVar2 * 1.4426950408889634);
  N2 = 1L << ((byte)N2_00 & 0x3f);
  dVar2 = log((double)kernSize);
  N1 = lround(dVar2 * 1.4426950408889634);
  kernSize = 1L << ((byte)N1 & 0x3f);
  printf("fft size = %6ld X%6ld,  ",kernSize,N2);
  if ((dataSize2 < 1) || ((long)a < 1)) {
    M = 0x16;
  }
  else {
    M = 0;
  }
  if (M == 0) {
    iVar1 = fft2dInit(CONCAT44(__seed,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78);
    M = (long)iVar1;
  }
  __ptr = calloc(kernSize * N2,4);
  if (__ptr == (void *)0x0) {
    M = 2;
  }
  if ((M == 0) && (i1 = (long)calloc(kernSize * N2,4), (void *)i1 == (void *)0x0)) {
    M = 2;
  }
  if ((M == 0) && (_rannum = fopen("conv2ddat.c2d","wb"), _rannum == (FILE *)0x0)) {
    M = -0x32;
  }
  if (M == 0) {
    fwrite(&dataSize2,8,1,_rannum);
    fwrite(&a,8,1,_rannum);
    fwrite(&kernSize2,8,1,_rannum);
    fwrite(&dataSize,8,1,_rannum);
    for (TheErr = 0; TheErr < (long)a; TheErr = TheErr + 1) {
      for (i2 = 0; i2 < dataSize2; i2 = i2 + 1) {
        iVar1 = rand();
        *(float *)((long)__ptr + (TheErr * N2 + i2) * 4) = (float)iVar1 * 9.313226e-10 + -1.0;
      }
      fwrite((void *)((long)__ptr + TheErr * N2 * 4),dataSize2 << 2,1,_rannum);
    }
    for (TheErr = 0; TheErr < dataSize; TheErr = TheErr + 1) {
      for (i2 = 0; i2 < kernSize2; i2 = i2 + 1) {
        iVar1 = rand();
        *(float *)(i1 + (TheErr * N2 + i2) * 4) = (float)iVar1 * 9.313226e-10 + -1.0;
      }
      fwrite((void *)(i1 + TheErr * N2 * 4),kernSize2 << 2,1,_rannum);
    }
    rfft2d(unaff_retaddr,N,N2);
    rfft2d(unaff_retaddr,N,N2);
    rspect2dprod((float *)i2,(float *)TheErr,(float *)0x0,N2_00,N1);
    rifft2d((float *)N2,kernSize,kernSize2);
    fwrite(__ptr,kernSize * N2 * 4,1,_rannum);
    fclose(_rannum);
    free((void *)i1);
    free(__ptr);
    fft2dFree();
  }
  else {
    if (M == 2) {
      printf(" out of memory \n");
    }
    else {
      printf(" error \n");
    }
    fft2dFree();
  }
  printf(" Done. \n");
  return;
}

Assistant:

void main(){
long 	N = 256;	/* the number of cols in 2d ffts, must be power of 2 */
long 	N2 = 64;	/* the number of rows in 2d ffts, must be power of 2 */
long 	kernSize = 53;	/* kernal cols must be less than N */
long 	kernSize2 = 29;	/* kernal rows must be less than N2*/
long 	dataSize = N-kernSize+1;	/* data cols */
long 	dataSize2 = N2-kernSize2+1;	/* data rows */
float	*a;
float	*b;
long 	i1;
long 	i2;
long 	TheErr;
long		M;
long		M2;

FILE *fdataout;				/* output file */

unsigned int	randseed = 777;
int		rannum;
#if macintosh
	UnsignedWide 		TheTime1;
	Microseconds(&TheTime1);
	randseed = TheTime1.lo;
#endif

printf(" %zu  Byte Floats \n", sizeof(a[0]));
printf(" randseed = %10u\n", randseed);

srand(randseed);
M = lround(LOG2(N));
N = POW2(M);
M2 = lround(LOG2(N2));
N2 = POW2(M2);

printf("fft size = %6ld X%6ld,  ", N2, N);

if ((dataSize <= 0)||(dataSize2 <= 0)) TheErr = 22;
else TheErr = 0;

if(!TheErr){
	TheErr = fft2dInit(M2, M);
}

a = (float *) calloc(N2*N,sizeof(float) );	// calloc to zero pad data to fill N to N2
if (a == 0) TheErr = 2;
if(!TheErr){
	b = (float *) calloc(N2*N,sizeof(float) );	// calloc to zero pad data to fill N to N2
	if (b == 0) TheErr = 2;
}
if(!TheErr){
	fdataout = fopen("conv2ddat.c2d", "wb");
	if (fdataout == NULL) TheErr = -50;
}
if(!TheErr){

		/*  write sizes to fdataout */
	fwrite(&dataSize, sizeof(dataSize), 1, fdataout);
	fwrite(&dataSize2, sizeof(dataSize2), 1, fdataout);
	fwrite(&kernSize, sizeof(kernSize), 1, fdataout);
	fwrite(&kernSize2, sizeof(kernSize2), 1, fdataout);
		/*  set up a simple test case and write to fdataout */
	for (i2=0; i2<dataSize2; i2++){
		for (i1=0; i1<dataSize; i1++){
			rannum = rand();
			a[i2*N+i1] = BIPRAND(rannum);
		}
		fwrite(&a[i2*N], dataSize*sizeof(float), 1, fdataout);
	}
	for (i2=0; i2<kernSize2; i2++){
		for (i1=0; i1<kernSize; i1++){
			rannum = rand();
			b[i2*N+i1] = BIPRAND(rannum);
		}
		fwrite(&b[i2*N], kernSize*sizeof(float), 1, fdataout);
	}

	/* fast 2d convolution of zero padded sequences */
	rfft2d(a, M2, M);
	rfft2d(b, M2, M);
	rspect2dprod(a, b, a, N2, N);
	rifft2d(a, M2, M);

	/* write out answer */
	fwrite(a, N2*N*sizeof(float), 1, fdataout);

	fclose(fdataout);

	free(b);
	free(a);
	fft2dFree();
}
else{
	if(TheErr==2)	printf(" out of memory \n");
	else	printf(" error \n");
	fft2dFree();
}
printf(" Done. \n");
return;
}